

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubDHash::Read(ON_SubDHash *this,ON_BinaryArchive *archive)

{
  undefined3 uVar1;
  uint uVar2;
  bool bVar3;
  ON_SubDHashType OVar4;
  bool bVar5;
  long lVar6;
  ON_SubDHash *pOVar7;
  ON_SubDHash *pOVar8;
  uchar hash_type_as_unsigned;
  bool bIsEmpty;
  int chunk_version;
  ON_SubDHashType local_1e;
  bool local_1d;
  int local_1c;
  
  pOVar7 = &Empty;
  pOVar8 = this;
  for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar1 = *(undefined3 *)&pOVar7->field_0x1;
    uVar2 = pOVar7->m_vertex_count;
    pOVar8->m_hash_type = pOVar7->m_hash_type;
    *(undefined3 *)&pOVar8->field_0x1 = uVar1;
    pOVar8->m_vertex_count = uVar2;
    pOVar7 = (ON_SubDHash *)&pOVar7->m_edge_count;
    pOVar8 = (ON_SubDHash *)&pOVar8->m_edge_count;
  }
  *(undefined4 *)((this->m_face_hash).m_digest + 0x10) = Empty.m_face_hash.m_digest._16_4_;
  local_1c = 0;
  bVar3 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(archive,&local_1c);
  if (!bVar3) {
    return false;
  }
  local_1d = true;
  bVar3 = ON_BinaryArchive::ReadBool(archive,&local_1d);
  if (bVar3) {
    bVar3 = true;
    if (local_1d != false) goto LAB_005df4e9;
    local_1e = Unset;
    bVar3 = ON_BinaryArchive::ReadChar(archive,&local_1e);
    if (bVar3) {
      OVar4 = local_1e;
      if (Topology < local_1e) {
        ON_SubDIncrementErrorCount();
        OVar4 = Unset;
      }
      this->m_hash_type = OVar4;
      bVar3 = ON_BinaryArchive::ReadInt(archive,&this->m_vertex_count);
      if ((((bVar3) && (bVar3 = ON_SHA1_Hash::Read(&this->m_vertex_hash,archive), bVar3)) &&
          (bVar3 = ON_BinaryArchive::ReadInt(archive,&this->m_edge_count), bVar3)) &&
         ((bVar3 = ON_SHA1_Hash::Read(&this->m_edge_hash,archive), bVar3 &&
          (bVar3 = ON_BinaryArchive::ReadInt(archive,&this->m_face_count), bVar3)))) {
        bVar3 = ON_SHA1_Hash::Read(&this->m_face_hash,archive);
        goto LAB_005df4e9;
      }
    }
  }
  bVar3 = false;
LAB_005df4e9:
  bVar5 = ON_BinaryArchive::EndRead3dmChunk(archive);
  return (bool)(bVar5 & bVar3);
}

Assistant:

bool ON_SubDHash::Read(class ON_BinaryArchive& archive)
{
  *this = ON_SubDHash::Empty;

  int chunk_version = 0;
  if (false == archive.BeginRead3dmAnonymousChunk(&chunk_version))
    return false;

  bool rc = false;
  for (;;)
  {
    bool bIsEmpty = true;
    if (false == archive.ReadBool(&bIsEmpty))
      break;
    if (bIsEmpty)
    {
      rc = true;
      break;
    }

    // The SubD runtime serial number and geometry content serial numbers are runtime values.
    // When appropriate, calling contexts need to set these after reading.
    unsigned char hash_type_as_unsigned = 0;
    if (false == archive.ReadChar(&hash_type_as_unsigned))
      break;
    m_hash_type = ON_SubDHashTypeFromUnsigned(hash_type_as_unsigned);

    if (false == archive.ReadInt(&m_vertex_count))
      break;
    if (false == this->m_vertex_hash.Read(archive))
      break;
    if (false == archive.ReadInt(&m_edge_count))
      break;
    if (false == this->m_edge_hash.Read(archive))
      break;
    if (false == archive.ReadInt(&m_face_count))
      break;
    if (false == this->m_face_hash.Read(archive))
      break;
    rc = true;
    break;
  }

  if (false == archive.EndRead3dmChunk())
    rc = false;
  return rc;

}